

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int Run<std::_Bind<int(*(std::__cxx11::string))(std::__cxx11::string_const&)>>
              (_Bind<int_(*(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *f,size_t retries)

{
  pointer pcVar1;
  int iVar2;
  int *piVar3;
  stringstream stream;
  undefined1 *local_228 [2];
  undefined1 local_218 [16];
  undefined1 local_208 [8];
  _Alloc_hider local_200;
  char local_1f0 [16];
  undefined1 local_1e0 [8];
  _Alloc_hider local_1d8;
  char local_1c8 [16];
  timespec local_1b8;
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1e0 = (undefined1  [8])f->_M_f;
  pcVar1 = (f->_M_bound_args).
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
           ._M_head_impl._M_dataplus._M_p;
  local_1d8._M_p = local_1c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d8,pcVar1,
             pcVar1 + (f->_M_bound_args).
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                      ._M_head_impl._M_string_length);
  iVar2 = TryRun<std::_Bind<int(*(std::__cxx11::string))(std::__cxx11::string_const&)>>
                    ((_Bind<int_(*(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)local_1e0);
  if (local_1d8._M_p != local_1c8) {
    operator_delete(local_1d8._M_p);
  }
  if (retries != 0 && iVar2 != 0) {
    do {
      std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,"Command failed, retrying...\n",0x1c);
      std::__cxx11::stringbuf::str();
      Logger::Log(2,(string *)local_228);
      if (local_228[0] != local_218) {
        operator_delete(local_228[0]);
      }
      retries = retries - 1;
      std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
      std::ios_base::~ios_base(local_138);
      local_1b8.tv_sec = 1;
      local_1b8.tv_nsec = 0;
      do {
        iVar2 = nanosleep(&local_1b8,&local_1b8);
        if (iVar2 != -1) break;
        piVar3 = __errno_location();
      } while (*piVar3 == 4);
      local_208 = (undefined1  [8])f->_M_f;
      pcVar1 = (f->_M_bound_args).
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
               ._M_head_impl._M_dataplus._M_p;
      local_200._M_p = local_1f0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_200,pcVar1,
                 pcVar1 + (f->_M_bound_args).
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                          ._M_head_impl._M_string_length);
      iVar2 = TryRun<std::_Bind<int(*(std::__cxx11::string))(std::__cxx11::string_const&)>>
                        ((_Bind<int_(*(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)local_208);
      if (local_200._M_p != local_1f0) {
        operator_delete(local_200._M_p);
      }
      if (iVar2 == 0) {
        return 0;
      }
    } while (retries != 0);
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"Too many retries, giving up!\n",0x1d);
    std::__cxx11::stringbuf::str();
    Logger::Log(3,(string *)local_228);
    if (local_228[0] != local_218) {
      operator_delete(local_228[0]);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  return iVar2;
}

Assistant:

int Run(T f, size_t retries)
{
    auto result = TryRun(f);

    // success or no retry allowed
    if (!result || !retries) {
        return result;
    }

    while (retries-- > 0) {
        LOG_WARN("Command failed, retrying...\n");
        std::this_thread::sleep_for(std::chrono::seconds(1));
        result = TryRun(f);
        if (!result) {
            return 0;
        }
    }
    LOG_ERROR("Too many retries, giving up!\n");
    return result;
}